

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

uint * fetchTransformedBilinearARGB32PM<(TextureBlendType)4>
                 (uint *buffer,Operator *param_2,QSpanData *data,int y,int x,int length)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint *puVar7;
  uchar *puVar8;
  uchar *puVar9;
  int in_ECX;
  long in_RDX;
  uint *in_RDI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  double dVar10;
  double dVar11;
  uint br;
  uint bl;
  uint tr;
  uint tl;
  uint *s2;
  uint *s1;
  int disty;
  int distx;
  qreal py;
  qreal px;
  qreal iw;
  qreal fw;
  qreal fy_1;
  qreal fx_1;
  qreal fdw;
  qreal fdy_1;
  qreal fdx_1;
  QTextureData *image;
  int mid;
  int fdy;
  uint *b;
  uint *end;
  int tiled;
  qreal cy;
  qreal cx;
  int y2;
  int y1;
  int x2;
  int x1;
  int fy;
  int fx;
  int fdx;
  double local_108;
  int local_fc;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  qreal in_stack_ffffffffffffff18;
  qreal in_stack_ffffffffffffff20;
  double local_b8;
  double local_b0;
  double local_a8;
  uint *local_78;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  dVar10 = (double)in_R8D + 0.5;
  dVar11 = (double)in_ECX + 0.5;
  puVar7 = in_RDI + in_R9D;
  bVar4 = canUseFastMatrixPath
                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (QSpanData *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  if (bVar4) {
    local_c = (int)(*(double *)(in_RDX + 0x38) * 65536.0);
    iVar5 = (int)(*(double *)(in_RDX + 0x40) * 65536.0);
    local_10 = (int)((*(double *)(in_RDX + 0x50) * dVar11 + *(double *)(in_RDX + 0x38) * dVar10 +
                     *(double *)(in_RDX + 0x70)) * 65536.0) + -0x8000;
    local_14 = (int)((*(double *)(in_RDX + 0x58) * dVar11 + *(double *)(in_RDX + 0x40) * dVar10 +
                     *(double *)(in_RDX + 0x78)) * 65536.0) + -0x8000;
    if (iVar5 == 0) {
      iVar5 = qAbs<int>(&local_c);
      if (iVar5 < 0x10001) {
        (*bilinearFastTransformHelperARGB32PM[0][0])
                  (in_RDI,puVar7,(QTextureData *)(in_RDX + 0xa8),&local_10,&local_14,local_c,0);
      }
      else {
        iVar5 = qAbs<int>(&local_c);
        if (iVar5 < 0x20001) {
          local_fc = in_R9D;
          if (0x7ff < in_R9D * 2) {
            local_fc = (in_R9D + 1) / 2;
          }
          (*bilinearFastTransformHelperARGB32PM[0][0])
                    (in_RDI,in_RDI + local_fc,(QTextureData *)(in_RDX + 0xa8),&local_10,&local_14,
                     local_c,0);
          if (local_fc != in_R9D) {
            (*bilinearFastTransformHelperARGB32PM[0][0])
                      (in_RDI + local_fc,in_RDI + in_R9D,(QTextureData *)(in_RDX + 0xa8),&local_10,
                       &local_14,local_c,0);
          }
        }
        else {
          dVar10 = qAbs<double>((double *)(in_RDX + 0x58));
          if (0.125 <= dVar10) {
            (*bilinearFastTransformHelperARGB32PM[0][2])
                      (in_RDI,puVar7,(QTextureData *)(in_RDX + 0xa8),&local_10,&local_14,local_c,0);
          }
          else {
            (*bilinearFastTransformHelperARGB32PM[0][1])
                      (in_RDI,puVar7,(QTextureData *)(in_RDX + 0xa8),&local_10,&local_14,local_c,0);
          }
        }
      }
    }
    else {
      dVar10 = qAbs<double>((double *)(in_RDX + 0x38));
      if ((dVar10 < 0.125) || (dVar10 = qAbs<double>((double *)(in_RDX + 0x58)), dVar10 < 0.125)) {
        (*bilinearFastTransformHelperARGB32PM[0][3])
                  (in_RDI,puVar7,(QTextureData *)(in_RDX + 0xa8),&local_10,&local_14,local_c,iVar5);
      }
      else {
        (*bilinearFastTransformHelperARGB32PM[0][4])
                  (in_RDI,puVar7,(QTextureData *)(in_RDX + 0xa8),&local_10,&local_14,local_c,iVar5);
      }
    }
  }
  else {
    dVar1 = *(double *)(in_RDX + 0x38);
    dVar2 = *(double *)(in_RDX + 0x40);
    dVar3 = *(double *)(in_RDX + 0x48);
    local_a8 = *(double *)(in_RDX + 0x50) * dVar11 + *(double *)(in_RDX + 0x38) * dVar10 +
               *(double *)(in_RDX + 0x70);
    local_b0 = *(double *)(in_RDX + 0x58) * dVar11 + *(double *)(in_RDX + 0x40) * dVar10 +
               *(double *)(in_RDX + 0x78);
    local_b8 = *(double *)(in_RDX + 0x60) * dVar11 + *(double *)(in_RDX + 0x48) * dVar10 +
               *(double *)(in_RDX + 0x68);
    for (local_78 = in_RDI; local_78 < puVar7; local_78 = local_78 + 1) {
      if ((local_b8 != 0.0) || (NAN(local_b8))) {
        local_108 = 1.0 / local_b8;
      }
      else {
        local_108 = 1.0;
      }
      dVar10 = local_a8 * local_108 + -0.5;
      dVar11 = local_b0 * local_108 + -0.5;
      local_18 = (int)dVar10 - (uint)(dVar10 < 0.0);
      local_1c = -0x55555556;
      local_20 = (int)dVar11 - (uint)(dVar11 < 0.0);
      local_24 = -0x55555556;
      fetchTransformedBilinear_pixelBounds<(TextureBlendType)4>
                (*(int *)(in_RDX + 0xb0),*(int *)(in_RDX + 0xb8),*(int *)(in_RDX + 0xc0) + -1,
                 &local_18,&local_1c);
      fetchTransformedBilinear_pixelBounds<(TextureBlendType)4>
                (*(int *)(in_RDX + 0xb4),*(int *)(in_RDX + 0xbc),*(int *)(in_RDX + 0xc4) + -1,
                 &local_20,&local_24);
      puVar8 = QTextureData::scanLine((QTextureData *)(in_RDX + 0xa8),local_20);
      puVar9 = QTextureData::scanLine((QTextureData *)(in_RDX + 0xa8),local_24);
      uVar6 = interpolate_4_pixels
                        ((uint)((ulong)puVar9 >> 0x20),(uint)puVar9,
                         *(uint *)(puVar8 + (long)local_18 * 4),
                         *(uint *)(puVar8 + (long)local_1c * 4),
                         *(uint *)(puVar9 + (long)local_18 * 4),
                         *(uint *)(puVar9 + (long)local_1c * 4));
      *local_78 = uVar6;
      local_a8 = dVar1 + local_a8;
      local_b0 = dVar2 + local_b0;
      local_b8 = dVar3 + local_b8;
      if ((local_b8 == 0.0) && (!NAN(local_b8))) {
        local_b8 = dVar3 + local_b8;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static const uint * QT_FASTCALL fetchTransformedBilinearARGB32PM(uint *buffer, const Operator *,
                                                                 const QSpanData *data, int y, int x,
                                                                 int length)
{
    const qreal cx = x + qreal(0.5);
    const qreal cy = y + qreal(0.5);
    constexpr int tiled = (blendType == BlendTransformedBilinearTiled) ? 1 : 0;

    uint *end = buffer + length;
    uint *b = buffer;
    if (canUseFastMatrixPath(cx, cy, length, data)) {
        // The increment pr x in the scanline
        int fdx = (int)(data->m11 * fixed_scale);
        int fdy = (int)(data->m12 * fixed_scale);

        int fx = int((data->m21 * cy
                      + data->m11 * cx + data->dx) * fixed_scale);
        int fy = int((data->m22 * cy
                      + data->m12 * cx + data->dy) * fixed_scale);

        fx -= half_point;
        fy -= half_point;

        if (fdy == 0) { // simple scale, no rotation or shear
            if (qAbs(fdx) <= fixed_scale) {
                // simple scale up on X
                bilinearFastTransformHelperARGB32PM[tiled][SimpleScaleTransform](b, end, data->texture, fx, fy, fdx, fdy);
            } else if (qAbs(fdx) <= 2 * fixed_scale) {
                // simple scale down on X, less than 2x
                const int mid = (length * 2 < BufferSize) ? length : ((length + 1) / 2);
                bilinearFastTransformHelperARGB32PM[tiled][SimpleScaleTransform](buffer, buffer + mid, data->texture, fx, fy, fdx, fdy);
                if (mid != length)
                    bilinearFastTransformHelperARGB32PM[tiled][SimpleScaleTransform](buffer + mid, buffer + length, data->texture, fx, fy, fdx, fdy);
            } else if (qAbs(data->m22) < qreal(1./8.)) {
                // scale up more than 8x (on Y)
                bilinearFastTransformHelperARGB32PM[tiled][UpscaleTransform](b, end, data->texture, fx, fy, fdx, fdy);
            } else {
                // scale down on X
                bilinearFastTransformHelperARGB32PM[tiled][DownscaleTransform](b, end, data->texture, fx, fy, fdx, fdy);
            }
        } else { // rotation or shear
            if (qAbs(data->m11) < qreal(1./8.) || qAbs(data->m22) < qreal(1./8.) ) {
                // if we are zooming more than 8 times, we use 8bit precision for the position.
                bilinearFastTransformHelperARGB32PM[tiled][RotateTransform](b, end, data->texture, fx, fy, fdx, fdy);
            } else {
                // we are zooming less than 8x, use 4bit precision
                bilinearFastTransformHelperARGB32PM[tiled][FastRotateTransform](b, end, data->texture, fx, fy, fdx, fdy);
            }
        }
    } else {
        const QTextureData &image = data->texture;

        const qreal fdx = data->m11;
        const qreal fdy = data->m12;
        const qreal fdw = data->m13;

        qreal fx = data->m21 * cy + data->m11 * cx + data->dx;
        qreal fy = data->m22 * cy + data->m12 * cx + data->dy;
        qreal fw = data->m23 * cy + data->m13 * cx + data->m33;

        while (b < end) {
            const qreal iw = fw == 0 ? 1 : 1 / fw;
            const qreal px = fx * iw - qreal(0.5);
            const qreal py = fy * iw - qreal(0.5);

            int x1 = int(px) - (px < 0);
            int x2;
            int y1 = int(py) - (py < 0);
            int y2;

            int distx = int((px - x1) * 256);
            int disty = int((py - y1) * 256);

            fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
            fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);

            const uint *s1 = (const uint *)data->texture.scanLine(y1);
            const uint *s2 = (const uint *)data->texture.scanLine(y2);

            uint tl = s1[x1];
            uint tr = s1[x2];
            uint bl = s2[x1];
            uint br = s2[x2];

            *b = interpolate_4_pixels(tl, tr, bl, br, distx, disty);

            fx += fdx;
            fy += fdy;
            fw += fdw;
            //force increment to avoid /0
            if (!fw) {
                fw += fdw;
            }
            ++b;
        }
    }

    return buffer;
}